

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint zlib_decompress(uchar **out,size_t *outsize,size_t expected_size,uchar *in,size_t insize,
                    LodePNGDecompressSettings *settings)

{
  uint uVar1;
  ucvector v;
  ucvector local_48;
  
  if (settings->custom_zlib !=
      (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr *)0x0) {
    uVar1 = (*settings->custom_zlib)(out,outsize,in,insize,settings);
    return uVar1;
  }
  local_48.data = *out;
  local_48.size = *outsize;
  local_48.allocsize = local_48.size;
  if (expected_size != 0) {
    ucvector_resize(&local_48,local_48.size + expected_size);
    local_48.size = *outsize;
  }
  uVar1 = lodepng_zlib_decompressv(&local_48,in,insize,settings);
  *out = local_48.data;
  *outsize = local_48.size;
  return uVar1;
}

Assistant:

static unsigned zlib_decompress(unsigned char** out, size_t* outsize, size_t expected_size,
                                const unsigned char* in, size_t insize, const LodePNGDecompressSettings* settings) {
  if(settings->custom_zlib) {
    return settings->custom_zlib(out, outsize, in, insize, settings);
  } else {
    unsigned error;
    ucvector v = ucvector_init(*out, *outsize);
    if(expected_size) {
      /*reserve the memory to avoid intermediate reallocations*/
      ucvector_resize(&v, *outsize + expected_size);
      v.size = *outsize;
    }
    error = lodepng_zlib_decompressv(&v, in, insize, settings);
    *out = v.data;
    *outsize = v.size;
    return error;
  }
}